

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_role.hxx
# Opt level: O1

string * __thiscall
nuraft::srv_role_to_string_abi_cxx11_(string *__return_storage_ptr__,nuraft *this,srv_role _role)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 3) {
    pcVar3 = "leader";
    pcVar1 = "";
  }
  else if (iVar2 == 2) {
    pcVar3 = "candidate";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "follower";
    pcVar1 = "";
  }
  else {
    pcVar3 = "UNKNOWN";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ATTR_UNUSED
       srv_role_to_string(srv_role _role)
{
    switch (_role) {
    case follower:      return "follower";
    case candidate:     return "candidate";
    case leader:        return "leader";
    default:            return "UNKNOWN";
    }
    return "UNKNOWN";
}